

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

MultipleConcatenationExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MultipleConcatenationExpressionSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::syntax::ConcatenationExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1,
          ConcatenationExpressionSyntax *args_2,Token *args_3)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  MultipleConcatenationExpressionSyntax *pMVar11;
  
  pMVar11 = (MultipleConcatenationExpressionSyntax *)allocate(this,0x48,8);
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_3->kind;
  uVar8 = args_3->field_0x2;
  NVar9.raw = (args_3->numFlags).raw;
  uVar10 = args_3->rawLen;
  pIVar2 = args_3->info;
  (pMVar11->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       MultipleConcatenationExpression;
  (pMVar11->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent =
       (SyntaxNode *)0x0;
  (pMVar11->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (SyntaxNode *)0x0;
  (pMVar11->openBrace).kind = TVar3;
  (pMVar11->openBrace).field_0x2 = uVar4;
  (pMVar11->openBrace).numFlags = (NumericTokenFlags)NVar5.raw;
  (pMVar11->openBrace).rawLen = uVar6;
  (pMVar11->openBrace).info = pIVar1;
  (pMVar11->expression).ptr = args_1;
  (pMVar11->concatenation).ptr = args_2;
  (pMVar11->closeBrace).kind = TVar7;
  (pMVar11->closeBrace).field_0x2 = uVar8;
  (pMVar11->closeBrace).numFlags = (NumericTokenFlags)NVar9.raw;
  (pMVar11->closeBrace).rawLen = uVar10;
  (pMVar11->closeBrace).info = pIVar2;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pMVar11;
  (args_2->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent =
       (SyntaxNode *)pMVar11;
  return pMVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }